

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinAnalytic_fp.c
# Opt level: O1

int DampingFn(long iter,N_Vector u_val,N_Vector g_val,sunrealtype *qt_fn,long depth,void *user_data,
             sunrealtype *damping_factor)

{
  int i_1;
  long lVar1;
  long lVar2;
  long lVar3;
  double dVar4;
  double dVar5;
  sunrealtype fn [3];
  double adStack_38 [4];
  
  if (depth == 0) {
    *damping_factor = 0.5;
  }
  else {
    dVar5 = 0.0;
    if (0 < depth) {
      lVar1 = 0;
      do {
        dVar5 = dVar5 + qt_fn[lVar1] * qt_fn[lVar1];
        lVar1 = lVar1 + 1;
      } while (depth != lVar1);
    }
    lVar1 = N_VGetArrayPointer(g_val);
    lVar2 = N_VGetArrayPointer(u_val);
    lVar3 = 0;
    do {
      adStack_38[lVar3] = *(double *)(lVar1 + lVar3 * 8) - *(double *)(lVar2 + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    dVar4 = 0.0;
    lVar1 = 0;
    do {
      dVar4 = dVar4 + adStack_38[lVar1] * adStack_38[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    dVar4 = 1.0 - dVar5 / dVar4;
    dVar5 = 0.0;
    if (0.0 < dVar4) {
      if (dVar4 < 0.0) {
        dVar5 = sqrt(dVar4);
      }
      else {
        dVar5 = SQRT(dVar4);
      }
    }
    *damping_factor = dVar5 * -0.5 + 0.9;
  }
  return 0;
}

Assistant:

static int DampingFn(long int iter, N_Vector u_val, N_Vector g_val,
                     sunrealtype* qt_fn, long int depth, void* user_data,
                     sunrealtype* damping_factor)
{
  if (depth == 0) { *damping_factor = 0.5; }
  else
  {
    /* Compute ||Q^T fn||^2 */
    sunrealtype qt_fn_norm_sqr = ZERO;
    for (long int i = 0; i < depth; i++)
    {
      qt_fn_norm_sqr += qt_fn[i] * qt_fn[i];
    }

    /* Compute ||fn||^2 = ||G(u_n) - u_n||^2 */
    sunrealtype* g_data = N_VGetArrayPointer(g_val);
    sunrealtype* u_data = N_VGetArrayPointer(u_val);
    sunrealtype fn[3];
    for (int i = 0; i < 3; i++) { fn[i] = g_data[i] - u_data[i]; }
    sunrealtype fn_norm_sqr = ZERO;
    for (int i = 0; i < 3; i++) { fn_norm_sqr += fn[i] * fn[i]; }

    /* Compute the gain = sqrt(1 - ||Q^T fn||^2 / ||fn||^2) */
    sunrealtype gain = SUNRsqrt(ONE - qt_fn_norm_sqr / fn_norm_sqr);

    *damping_factor = 0.9 - 0.5 * gain;
  }

  return 0;
}